

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O1

FString ZCCTokenName(int terminal)

{
  uint in_ESI;
  int token;
  undefined4 in_register_0000003c;
  FScanner *this;
  
  this = (FScanner *)CONCAT44(in_register_0000003c,terminal);
  if (in_ESI == 0x30) {
    FString::FString((FString *)this,"end of file");
  }
  else {
    if (in_ESI - 1 < 0x8e) {
      token = -in_ESI;
      if (BackTokenMap[in_ESI] != 0) {
        token = (int)BackTokenMap[in_ESI];
      }
    }
    else {
      token = -in_ESI;
    }
    FScanner::TokenName(this,token,(char *)0x0);
  }
  return (FString)(char *)this;
}

Assistant:

static FString ZCCTokenName(int terminal)
{
	if (terminal == ZCC_EOF)
	{
		return "end of file";
	}
	int sc_token;
	if (terminal > 0 && terminal < (int)countof(BackTokenMap))
	{
		sc_token = BackTokenMap[terminal];
		if (sc_token == 0)
		{ // This token was not initialized. Whoops!
			sc_token = -terminal;
		}
	}
	else
	{ // This should never happen.
		sc_token = -terminal;
	}
	return FScanner::TokenName(sc_token);
}